

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subquery_expression.cpp
# Opt level: O3

string * __thiscall
duckdb::SubqueryExpression::ToString_abi_cxx11_
          (string *__return_storage_ptr__,SubqueryExpression *this)

{
  undefined8 *puVar1;
  long lVar2;
  pointer pPVar3;
  long *plVar4;
  undefined8 *puVar5;
  pointer pSVar6;
  ulong *puVar7;
  InternalException *this_00;
  size_type *psVar8;
  long *plVar9;
  undefined8 uVar10;
  ulong uVar11;
  string local_130;
  ulong *local_110;
  long local_108;
  ulong local_100;
  long lStack_f8;
  undefined8 *local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  long lStack_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  string local_90;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 local_50 [16];
  ulong local_40 [2];
  
  switch(this->subquery_type) {
  case SCALAR:
    pSVar6 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
             ::operator->(&this->subquery);
    (*(pSVar6->super_SQLStatement)._vptr_SQLStatement[2])(&local_110);
    puVar5 = (undefined8 *)
             ::std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,0x13891ac);
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    psVar8 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_130.field_2._M_allocated_capacity = *psVar8;
      local_130.field_2._8_8_ = puVar5[3];
    }
    else {
      local_130.field_2._M_allocated_capacity = *psVar8;
      local_130._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_130._M_string_length = puVar5[1];
    *puVar5 = psVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    plVar4 = (long *)::std::__cxx11::string::append((char *)&local_130);
    break;
  case EXISTS:
    pSVar6 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
             ::operator->(&this->subquery);
    (*(pSVar6->super_SQLStatement)._vptr_SQLStatement[2])(&local_110);
    puVar5 = (undefined8 *)
             ::std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,0x13659f2);
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    psVar8 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_130.field_2._M_allocated_capacity = *psVar8;
      local_130.field_2._8_8_ = puVar5[3];
    }
    else {
      local_130.field_2._M_allocated_capacity = *psVar8;
      local_130._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_130._M_string_length = puVar5[1];
    *puVar5 = psVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    plVar4 = (long *)::std::__cxx11::string::append((char *)&local_130);
    break;
  case NOT_EXISTS:
    pSVar6 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
             ::operator->(&this->subquery);
    (*(pSVar6->super_SQLStatement)._vptr_SQLStatement[2])(&local_110);
    puVar5 = (undefined8 *)
             ::std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,0x13659ee);
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    psVar8 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_130.field_2._M_allocated_capacity = *psVar8;
      local_130.field_2._8_8_ = puVar5[3];
    }
    else {
      local_130.field_2._M_allocated_capacity = *psVar8;
      local_130._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_130._M_string_length = puVar5[1];
    *puVar5 = psVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    plVar4 = (long *)::std::__cxx11::string::append((char *)&local_130);
    break;
  case ANY:
    pPVar3 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(&this->child);
    (*(pPVar3->super_BaseExpression)._vptr_BaseExpression[8])(local_50);
    plVar4 = (long *)::std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x13891ac);
    plVar9 = plVar4 + 2;
    if ((long *)*plVar4 == plVar9) {
      local_60 = *plVar9;
      lStack_58 = plVar4[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar9;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar9;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)::std::__cxx11::string::append((char *)&local_70);
    puVar7 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar7) {
      local_c0 = *puVar7;
      lStack_b8 = plVar4[3];
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *puVar7;
      local_d0 = (ulong *)*plVar4;
    }
    local_c8 = plVar4[1];
    *plVar4 = (long)puVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    ExpressionTypeToOperator_abi_cxx11_
              (&local_90,(duckdb *)(ulong)this->comparison_type,(ExpressionType)local_c8);
    uVar11 = 0xf;
    if (local_d0 != &local_c0) {
      uVar11 = local_c0;
    }
    if (uVar11 < local_90._M_string_length + local_c8) {
      uVar10 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        uVar10 = local_90.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar10 < local_90._M_string_length + local_c8) goto LAB_00756363;
      puVar5 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_d0);
    }
    else {
LAB_00756363:
      puVar5 = (undefined8 *)
               ::std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_90._M_dataplus._M_p)
      ;
    }
    local_f0 = &local_e0;
    puVar1 = puVar5 + 2;
    if ((undefined8 *)*puVar5 == puVar1) {
      local_e0 = *puVar1;
      uStack_d8 = puVar5[3];
    }
    else {
      local_e0 = *puVar1;
      local_f0 = (undefined8 *)*puVar5;
    }
    local_e8 = puVar5[1];
    *puVar5 = puVar1;
    puVar5[1] = 0;
    *(undefined1 *)puVar1 = 0;
    plVar4 = (long *)::std::__cxx11::string::append((char *)&local_f0);
    puVar7 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar7) {
      local_100 = *puVar7;
      lStack_f8 = plVar4[3];
      local_110 = &local_100;
    }
    else {
      local_100 = *puVar7;
      local_110 = (ulong *)*plVar4;
    }
    local_108 = plVar4[1];
    *plVar4 = (long)puVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    pSVar6 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
             ::operator->(&this->subquery);
    (*(pSVar6->super_SQLStatement)._vptr_SQLStatement[2])(&local_b0,pSVar6);
    uVar11 = 0xf;
    if (local_110 != &local_100) {
      uVar11 = local_100;
    }
    if (uVar11 < (ulong)(local_a8 + local_108)) {
      uVar11 = 0xf;
      if (local_b0 != local_a0) {
        uVar11 = local_a0[0];
      }
      if (uVar11 < (ulong)(local_a8 + local_108)) goto LAB_0075648d;
      puVar5 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_110);
    }
    else {
LAB_0075648d:
      puVar5 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_b0);
    }
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    psVar8 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_130.field_2._M_allocated_capacity = *psVar8;
      local_130.field_2._8_8_ = puVar5[3];
    }
    else {
      local_130.field_2._M_allocated_capacity = *psVar8;
      local_130._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_130._M_string_length = puVar5[1];
    *puVar5 = psVar8;
    puVar5[1] = 0;
    *(undefined1 *)psVar8 = 0;
    plVar4 = (long *)::std::__cxx11::string::append((char *)&local_130);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar8 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar8) {
      lVar2 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if (local_b0 != local_a0) {
      operator_delete(local_b0);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70);
    }
    puVar7 = local_40;
    goto LAB_007565cb;
  default:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_130,"Unrecognized type for subquery","");
    InternalException::InternalException(this_00,&local_130);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar8 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar8) {
    lVar2 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  puVar7 = &local_100;
LAB_007565cb:
  if ((ulong *)puVar7[-2] != puVar7) {
    operator_delete((ulong *)puVar7[-2]);
  }
  return __return_storage_ptr__;
}

Assistant:

string SubqueryExpression::ToString() const {
	switch (subquery_type) {
	case SubqueryType::ANY:
		return "(" + child->ToString() + " " + ExpressionTypeToOperator(comparison_type) + " ANY(" +
		       subquery->ToString() + "))";
	case SubqueryType::EXISTS:
		return "EXISTS(" + subquery->ToString() + ")";
	case SubqueryType::NOT_EXISTS:
		return "NOT EXISTS(" + subquery->ToString() + ")";
	case SubqueryType::SCALAR:
		return "(" + subquery->ToString() + ")";
	default:
		throw InternalException("Unrecognized type for subquery");
	}
}